

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

int double_conversion::Bignum::PlusCompare(Bignum *a,Bignum *b,Bignum *c)

{
  long lVar1;
  short sVar2;
  bool bVar3;
  long lVar4;
  short sVar5;
  int iVar6;
  Bignum *pBVar7;
  int iVar8;
  Chunk CVar9;
  uint uVar10;
  uint uVar11;
  Bignum *pBVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int local_44;
  
  do {
    pBVar12 = a;
    a = b;
    sVar5 = pBVar12->exponent_;
    lVar15 = (long)(int)sVar5;
    lVar14 = pBVar12->used_bigits_ + lVar15;
    lVar18 = (long)a->exponent_;
    lVar17 = a->used_bigits_ + lVar18;
    iVar13 = (int)lVar14;
    iVar16 = (int)lVar17;
    b = pBVar12;
  } while (iVar13 < iVar16);
  sVar2 = c->exponent_;
  lVar1 = (long)sVar2 + (long)c->used_bigits_;
  iVar8 = (int)lVar1;
  iVar6 = -1;
  if (((iVar8 <= iVar13 + 1) && (iVar6 = 1, iVar13 <= iVar8)) &&
     ((sVar5 < iVar16 || (iVar6 = -1, iVar8 <= iVar13)))) {
    pBVar7 = pBVar12;
    if (a->exponent_ < sVar5) {
      pBVar7 = a;
    }
    sVar5 = pBVar7->exponent_;
    if (sVar2 < sVar5) {
      sVar5 = c->exponent_;
    }
    pBVar7 = (Bignum *)(c->bigits_buffer_ + (long)c->used_bigits_ + -1);
    uVar11 = 0;
    lVar4 = lVar1;
    do {
      lVar19 = lVar4;
      if (lVar19 <= sVar5) break;
      iVar13 = 0;
      if ((lVar15 < lVar19) && (lVar19 <= lVar14)) {
        iVar13 = *(int *)((long)pBVar12 + lVar19 * 4 + lVar15 * -4);
      }
      iVar16 = 0;
      if ((lVar18 < lVar19) && (iVar16 = 0, lVar19 <= lVar17)) {
        iVar16 = *(int *)((long)a + lVar19 * 4 + lVar18 * -4);
      }
      CVar9 = 0;
      if (sVar2 < lVar19 && lVar19 <= lVar1) {
        CVar9._0_2_ = pBVar7->used_bigits_;
        CVar9._2_2_ = pBVar7->exponent_;
      }
      uVar10 = (CVar9 + uVar11) - (iVar16 + iVar13);
      if (CVar9 + uVar11 < (uint)(iVar16 + iVar13)) {
        local_44 = 1;
        bVar3 = false;
      }
      else {
        bVar3 = uVar10 < 2;
        if (bVar3) {
          uVar11 = uVar10 * 0x10000000;
        }
        else {
          local_44 = -1;
          uVar11 = uVar10;
        }
      }
      pBVar7 = (Bignum *)((long)(pBVar7 + 0xffffffffffffffff) + 0x200);
      lVar4 = lVar19 + -1;
    } while (bVar3);
    iVar6 = -(uint)(uVar11 != 0);
    if (sVar5 < lVar19) {
      iVar6 = local_44;
    }
  }
  return iVar6;
}

Assistant:

int Bignum::PlusCompare(const Bignum& a, const Bignum& b, const Bignum& c) {
  DOUBLE_CONVERSION_ASSERT(a.IsClamped());
  DOUBLE_CONVERSION_ASSERT(b.IsClamped());
  DOUBLE_CONVERSION_ASSERT(c.IsClamped());
  if (a.BigitLength() < b.BigitLength()) {
    return PlusCompare(b, a, c);
  }
  if (a.BigitLength() + 1 < c.BigitLength()) {
    return -1;
  }
  if (a.BigitLength() > c.BigitLength()) {
    return +1;
  }
  // The exponent encodes 0-bigits. So if there are more 0-digits in 'a' than
  // 'b' has digits, then the bigit-length of 'a'+'b' must be equal to the one
  // of 'a'.
  if (a.exponent_ >= b.BigitLength() && a.BigitLength() < c.BigitLength()) {
    return -1;
  }

  Chunk borrow = 0;
  // Starting at min_exponent all digits are == 0. So no need to compare them.
  const int min_exponent = (std::min)((std::min)(a.exponent_, b.exponent_), c.exponent_);
  for (int i = c.BigitLength() - 1; i >= min_exponent; --i) {
    const Chunk chunk_a = a.BigitOrZero(i);
    const Chunk chunk_b = b.BigitOrZero(i);
    const Chunk chunk_c = c.BigitOrZero(i);
    const Chunk sum = chunk_a + chunk_b;
    if (sum > chunk_c + borrow) {
      return +1;
    } else {
      borrow = chunk_c + borrow - sum;
      if (borrow > 1) {
        return -1;
      }
      borrow <<= kBigitSize;
    }
  }
  if (borrow == 0) {
    return 0;
  }
  return -1;
}